

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O3

void __thiscall
oout::dirty::Test::
Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
          (Test *this,string *name,shared_ptr<oout::NamedTest> *tests,
          shared_ptr<oout::NamedTest> *tests_1,shared_ptr<oout::NamedTest> *tests_2)

{
  undefined1 local_39;
  NamedTest *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<const_oout::Test> local_28;
  
  local_38 = (NamedTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,std::__cxx11::string_const&,std::shared_ptr<oout::NamedTest>const&,std::shared_ptr<oout::NamedTest>const&,std::shared_ptr<oout::NamedTest>const&>
            (&_Stack_30,&local_38,(allocator<oout::NamedTest> *)&local_39,name,tests,tests_1,tests_2
            );
  local_28.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_Test;
  local_28.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_30._M_pi;
  local_38 = (NamedTest *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Test(this,&local_28);
  if (local_28.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

Test(
		const std::string &name,
		const T & ... tests
	) : Test(std::make_shared<oout::NamedTest>(name, tests...))
	{
	}